

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O3

vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
* __thiscall
plot::detail::
vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
::next(vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
       *__return_storage_ptr__,
      vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
      *this)

{
  size_t sVar1;
  Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *pFVar2;
  ptrdiff_t pVar3;
  BrailleCanvas *pBVar4;
  block_t *pbVar5;
  block_t *pbVar6;
  BrailleCanvas *pBVar7;
  
  sVar1 = this->margin_;
  if (sVar1 == 0) {
    vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>
    ::next_impl<0ul,1ul>(__return_storage_ptr__);
  }
  else {
    __return_storage_ptr__->vbox_ = this->vbox_;
    __return_storage_ptr__->margin_ = sVar1 - 1;
    pFVar2 = (this->lines_).
             super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
             .
             super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
             .
             super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
             ._M_head_impl.line_.frame_;
    pVar3 = (this->lines_).
            super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
            .
            super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
            .
            super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
            ._M_head_impl.line_.overflow_;
    pBVar4 = (this->lines_).
             super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
             .
             super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
             .
             super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
             ._M_head_impl.line_.line_.line_.canvas_;
    pbVar5 = ((const_iterator *)
             ((long)&(this->lines_).
                     super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                     .
                     super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                     .
                     super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                     ._M_head_impl.line_.line_ + 8))->_M_current;
    pbVar6 = ((const_iterator *)
             ((long)&(this->lines_).
                     super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                     .
                     super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                     .
                     super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                     ._M_head_impl.line_.end_ + 8))->_M_current;
    (__return_storage_ptr__->lines_).
    super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
    ._M_head_impl.line_.end_.line_.canvas_ =
         (this->lines_).
         super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
         .
         super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
         .
         super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
         ._M_head_impl.line_.end_.line_.canvas_;
    ((const_iterator *)
    ((long)&(__return_storage_ptr__->lines_).
            super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
            .
            super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
            .
            super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
            ._M_head_impl.line_.end_ + 8))->_M_current = pbVar6;
    (__return_storage_ptr__->lines_).
    super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
    ._M_head_impl.line_.line_.line_.canvas_ = pBVar4;
    ((const_iterator *)
    ((long)&(__return_storage_ptr__->lines_).
            super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
            .
            super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
            .
            super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
            ._M_head_impl.line_.line_ + 8))->_M_current = pbVar5;
    (__return_storage_ptr__->lines_).
    super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
    ._M_head_impl.line_.frame_ = pFVar2;
    (__return_storage_ptr__->lines_).
    super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
    ._M_head_impl.line_.overflow_ = pVar3;
    pFVar2 = (this->lines_).
             super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
             .
             super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
             ._M_head_impl.line_.frame_;
    pVar3 = (this->lines_).
            super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
            .
            super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
            ._M_head_impl.line_.overflow_;
    pBVar4 = (this->lines_).
             super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
             .
             super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
             ._M_head_impl.line_.line_.line_.canvas_;
    pbVar5 = ((const_iterator *)
             ((long)&(this->lines_).
                     super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                     .
                     super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                     ._M_head_impl.line_.line_.line_ + 8))->_M_current;
    pbVar6 = ((const_iterator *)
             ((long)&(this->lines_).
                     super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                     .
                     super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                     ._M_head_impl.line_.end_.line_ + 8))->_M_current;
    (__return_storage_ptr__->lines_).
    super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
    ._M_head_impl.line_.end_.line_.canvas_ =
         (this->lines_).
         super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
         .
         super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
         ._M_head_impl.line_.end_.line_.canvas_;
    ((const_iterator *)
    ((long)&(__return_storage_ptr__->lines_).
            super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
            .
            super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
            ._M_head_impl.line_.end_.line_ + 8))->_M_current = pbVar6;
    (__return_storage_ptr__->lines_).
    super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
    ._M_head_impl.line_.line_.line_.canvas_ = pBVar4;
    ((const_iterator *)
    ((long)&(__return_storage_ptr__->lines_).
            super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
            .
            super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
            ._M_head_impl.line_.line_.line_ + 8))->_M_current = pbVar5;
    (__return_storage_ptr__->lines_).
    super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
    ._M_head_impl.line_.frame_ = pFVar2;
    (__return_storage_ptr__->lines_).
    super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
    ._M_head_impl.line_.overflow_ = pVar3;
    pVar3 = (this->ends_).
            super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
            .
            super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
            .
            super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
            ._M_head_impl.line_.overflow_;
    pBVar4 = (this->ends_).
             super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
             .
             super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
             .
             super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
             ._M_head_impl.line_.line_.line_.canvas_;
    pbVar5 = ((const_iterator *)
             ((long)&(this->ends_).
                     super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                     .
                     super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                     .
                     super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                     ._M_head_impl.line_.line_ + 8))->_M_current;
    pBVar7 = (this->ends_).
             super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
             .
             super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
             .
             super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
             ._M_head_impl.line_.end_.line_.canvas_;
    pbVar6 = ((const_iterator *)
             ((long)&(this->ends_).
                     super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                     .
                     super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                     .
                     super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                     ._M_head_impl.line_.end_ + 8))->_M_current;
    (__return_storage_ptr__->ends_).
    super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
    ._M_head_impl.line_.frame_ =
         (this->ends_).
         super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
         .
         super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
         .
         super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
         ._M_head_impl.line_.frame_;
    (__return_storage_ptr__->ends_).
    super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
    ._M_head_impl.line_.overflow_ = pVar3;
    (__return_storage_ptr__->ends_).
    super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
    ._M_head_impl.line_.line_.line_.canvas_ = pBVar4;
    ((const_iterator *)
    ((long)&(__return_storage_ptr__->ends_).
            super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
            .
            super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
            .
            super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
            ._M_head_impl.line_.line_ + 8))->_M_current = pbVar5;
    (__return_storage_ptr__->ends_).
    super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
    ._M_head_impl.line_.end_.line_.canvas_ = pBVar7;
    ((const_iterator *)
    ((long)&(__return_storage_ptr__->ends_).
            super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
            .
            super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
            .
            super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
            ._M_head_impl.line_.end_ + 8))->_M_current = pbVar6;
    pFVar2 = (this->ends_).
             super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
             .
             super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
             ._M_head_impl.line_.frame_;
    pVar3 = (this->ends_).
            super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
            .
            super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
            ._M_head_impl.line_.overflow_;
    pBVar4 = (this->ends_).
             super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
             .
             super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
             ._M_head_impl.line_.line_.line_.canvas_;
    pbVar5 = ((const_iterator *)
             ((long)&(this->ends_).
                     super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                     .
                     super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                     ._M_head_impl.line_.line_.line_ + 8))->_M_current;
    pbVar6 = ((const_iterator *)
             ((long)&(this->ends_).
                     super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                     .
                     super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                     ._M_head_impl.line_.end_.line_ + 8))->_M_current;
    (__return_storage_ptr__->ends_).
    super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
    ._M_head_impl.line_.end_.line_.canvas_ =
         (this->ends_).
         super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
         .
         super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
         ._M_head_impl.line_.end_.line_.canvas_;
    ((const_iterator *)
    ((long)&(__return_storage_ptr__->ends_).
            super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
            .
            super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
            ._M_head_impl.line_.end_.line_ + 8))->_M_current = pbVar6;
    (__return_storage_ptr__->ends_).
    super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
    ._M_head_impl.line_.line_.line_.canvas_ = pBVar4;
    ((const_iterator *)
    ((long)&(__return_storage_ptr__->ends_).
            super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
            .
            super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
            ._M_head_impl.line_.line_.line_ + 8))->_M_current = pbVar5;
    (__return_storage_ptr__->ends_).
    super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
    ._M_head_impl.line_.frame_ = pFVar2;
    (__return_storage_ptr__->ends_).
    super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
    ._M_head_impl.line_.overflow_ = pVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

vbox_line next() const {
            return margin_ ? vbox_line(vbox_, margin_ - 1, lines_, ends_)
                           : next_impl(std::make_index_sequence<sizeof...(Blocks)>());
        }